

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

uint llvm::dwarf::FormVendor(Form Form)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,Form);
  if (iVar1 < 0x1f20) {
    if ((iVar1 != 0x1f01) && (iVar1 != 0x1f02)) {
      return 0;
    }
  }
  else if ((iVar1 != 0x1f20) && (iVar1 != 0x1f21)) {
    return 0;
  }
  return 3;
}

Assistant:

unsigned llvm::dwarf::FormVendor(dwarf::Form Form) {
  switch (Form) {
  default:
    return 0;
#define HANDLE_DW_FORM(ID, NAME, VERSION, VENDOR)                              \
  case DW_FORM_##NAME:                                                         \
    return DWARF_VENDOR_##VENDOR;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}